

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDetector.cpp
# Opt level: O0

Result * ZXing::Pdf417::Detector::Detect(BinaryBitmap *image,bool multiple,bool tryRotate)

{
  bool bVar1;
  undefined1 uVar2;
  element_type *peVar3;
  byte in_CL;
  byte in_DL;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  Result *in_RDI;
  shared_ptr<ZXing::BitMatrix> newBits_1;
  BitMatrix *in_stack_00000078;
  shared_ptr<ZXing::BitMatrix> newBits;
  int rotate90;
  Result result;
  shared_ptr<const_ZXing::BitMatrix> binImg;
  Result *in_stack_fffffffffffffec8;
  BinaryBitmap *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  BitMatrix *in_stack_fffffffffffffee0;
  BitMatrix *in_stack_fffffffffffffef8;
  BitMatrix local_f0;
  BitMatrix *in_stack_ffffffffffffff30;
  BitMatrix local_a8 [2];
  int local_64;
  undefined1 in_stack_ffffffffffffffc7;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  shared_ptr<const_ZXing::BitMatrix> local_28;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  BinaryBitmap::getBitMatrix(in_stack_fffffffffffffed0);
  std::shared_ptr<ZXing::BitMatrix_const>::
  shared_ptr<ZXing::BitMatrix_const,ZXing::Pdf417::Detector::Detect(ZXing::BinaryBitmap_const&,bool,bool)::__0,void>
            (&local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_28);
  if (bVar1) {
    Result::Result((Result *)in_stack_fffffffffffffed0);
    for (local_64 = 0; local_64 <= (int)(uint)(local_12 & 1); local_64 = local_64 + 1) {
      std::__shared_ptr_access<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_fffffffffffffed0);
      uVar2 = HasStartPattern((BitMatrix *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                              (bool)in_stack_ffffffffffffffc7);
      if ((bool)uVar2) {
        in_stack_ffffffffffffffc8 = local_64 * 0x5a;
        if (local_64 != 0) {
          peVar3 = std::
                   __shared_ptr_access<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2c6bd3);
          BitMatrix::copy(local_a8,(EVP_PKEY_CTX *)peVar3,src);
          std::make_shared<ZXing::BitMatrix,ZXing::BitMatrix>(in_stack_fffffffffffffef8);
          BitMatrix::~BitMatrix((BitMatrix *)0x2c6c09);
          std::__shared_ptr_access<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2c6c16);
          BitMatrix::rotate90(in_stack_ffffffffffffff30);
          std::shared_ptr<ZXing::BitMatrix_const>::operator=
                    ((shared_ptr<const_ZXing::BitMatrix> *)in_stack_fffffffffffffed0,
                     (shared_ptr<ZXing::BitMatrix> *)in_stack_fffffffffffffec8);
          std::shared_ptr<ZXing::BitMatrix>::~shared_ptr((shared_ptr<ZXing::BitMatrix> *)0x2c6c42);
        }
        std::__shared_ptr_access<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_fffffffffffffed0);
        DetectBarcode_abi_cxx11_
                  (in_stack_00000078,
                   newBits_1.super___shared_ptr<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._7_1_);
        std::__cxx11::
        list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
        ::operator=((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                     *)in_stack_fffffffffffffee0,
                    (list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                     *)CONCAT17(uVar2,in_stack_fffffffffffffed8));
        std::__cxx11::
        list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
        ::~list((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                 *)0x2c6cd7);
        std::shared_ptr<const_ZXing::BitMatrix>::operator=
                  ((shared_ptr<const_ZXing::BitMatrix> *)in_stack_fffffffffffffed0,
                   &in_stack_fffffffffffffec8->bits);
        bVar1 = std::__cxx11::
                list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                ::empty((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                         *)&stack0xffffffffffffffb0);
        if (bVar1) {
          peVar3 = std::
                   __shared_ptr_access<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2c6d13);
          BitMatrix::copy(&local_f0,(EVP_PKEY_CTX *)peVar3,src_00);
          std::make_shared<ZXing::BitMatrix,ZXing::BitMatrix>(in_stack_fffffffffffffef8);
          BitMatrix::~BitMatrix((BitMatrix *)0x2c6d3d);
          std::__shared_ptr_access<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2c6d47);
          BitMatrix::rotate180(in_stack_fffffffffffffee0);
          std::__shared_ptr_access<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)in_stack_fffffffffffffed0);
          DetectBarcode_abi_cxx11_
                    (in_stack_00000078,
                     newBits_1.super___shared_ptr<ZXing::BitMatrix,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._7_1_);
          std::__cxx11::
          list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
          ::operator=((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                       *)in_stack_fffffffffffffee0,
                      (list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                       *)CONCAT17(uVar2,in_stack_fffffffffffffed8));
          std::__cxx11::
          list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
          ::~list((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                   *)0x2c6d95);
          in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 0xb4;
          std::shared_ptr<ZXing::BitMatrix_const>::operator=
                    ((shared_ptr<const_ZXing::BitMatrix> *)in_stack_fffffffffffffed0,
                     (shared_ptr<ZXing::BitMatrix> *)in_stack_fffffffffffffec8);
          std::shared_ptr<ZXing::BitMatrix>::~shared_ptr((shared_ptr<ZXing::BitMatrix> *)0x2c6dc4);
        }
        bVar1 = std::__cxx11::
                list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                ::empty((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
                         *)&stack0xffffffffffffffb0);
        if (!bVar1) {
          Result::Result((Result *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          goto LAB_002c6e9d;
        }
      }
    }
    std::shared_ptr<const_ZXing::BitMatrix>::shared_ptr
              ((shared_ptr<const_ZXing::BitMatrix> *)0x2c6e62);
    in_stack_fffffffffffffed0 = (BinaryBitmap *)&in_RDI->points;
    memset(in_stack_fffffffffffffed0,0,0x18);
    std::__cxx11::
    list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ::list((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
            *)0x2c6e86);
    in_RDI->rotation = -1;
LAB_002c6e9d:
    Result::~Result((Result *)in_stack_fffffffffffffed0);
  }
  else {
    std::shared_ptr<const_ZXing::BitMatrix>::shared_ptr
              ((shared_ptr<const_ZXing::BitMatrix> *)0x2c6ae3);
    memset(&in_RDI->points,0,0x18);
    std::__cxx11::
    list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
    ::list((list<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>,_std::allocator<std::array<ZXing::Nullable<ZXing::ResultPoint>,_8UL>_>_>
            *)0x2c6b07);
    in_RDI->rotation = -1;
  }
  std::shared_ptr<const_ZXing::BitMatrix>::~shared_ptr
            ((shared_ptr<const_ZXing::BitMatrix> *)0x2c6ed5);
  return in_RDI;
}

Assistant:

Detector::Result Detector::Detect(const BinaryBitmap& image, bool multiple, bool tryRotate)
{
	// construct a 'dummy' shared pointer, just be able to pass it up the call chain in DetectorResult
	// TODO: reimplement PDF Detector
	auto binImg = std::shared_ptr<const BitMatrix>(image.getBitMatrix(), [](const BitMatrix*){});
	if (!binImg)
		return {};

	Result result;

	for (int rotate90 = 0; rotate90 <= static_cast<int>(tryRotate); ++rotate90) {
		if (!HasStartPattern(*binImg, rotate90))
			continue;

		result.rotation = 90 * rotate90;
		if (rotate90) {
			auto newBits = std::make_shared<BitMatrix>(binImg->copy());
			newBits->rotate90();
			binImg = newBits;
		}

		result.points = DetectBarcode(*binImg, multiple);
		result.bits = binImg;
		if (result.points.empty()) {
			auto newBits = std::make_shared<BitMatrix>(binImg->copy());
			newBits->rotate180();
			result.points = DetectBarcode(*newBits, multiple);
			result.rotation += 180;
			result.bits = newBits;
		}

		if (!result.points.empty())
			return result;
	}

	return {};
}